

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O2

void __thiscall SequenceMeaning::Dump(SequenceMeaning *this,ostream *out)

{
  pointer ppSVar1;
  Activation *pAVar2;
  pointer ppSVar3;
  
  if (this->final_form->kind != MEANING) {
    __assert_fail("final_form->IsMeaning()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                  ,0xeb,"virtual void SequenceMeaning::Dump(std::ostream &)");
  }
  std::operator<<(out,"(meaning-sequence ");
  ppSVar3 = (this->body).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->body).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppSVar3 == ppSVar1) {
      if (this->final_form->kind != EMPTY) {
        Sexp::Dump(this->final_form,out);
      }
      std::operator<<(out,")");
      return;
    }
    if ((*ppSVar3)->kind != MEANING) break;
    pAVar2 = ((*ppSVar3)->field_1).activation;
    (*(code *)(pAVar2->parent->field_1).symbol_value)(pAVar2,out);
    std::operator<<(out," ");
    ppSVar3 = ppSVar3 + 1;
  }
  __assert_fail("b->IsMeaning()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.h"
                ,0xee,"virtual void SequenceMeaning::Dump(std::ostream &)");
}

Assistant:

void Dump(std::ostream &out) override {
    assert(final_form->IsMeaning());
    out << "(meaning-sequence ";
    for (Sexp *b : body) {
      assert(b->IsMeaning());
      b->meaning->Dump(out);
      out << " ";
    }

    if (!final_form->IsEmpty()) {
      final_form->Dump(out);
    }

    out << ")";
  }